

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftcalc.c
# Opt level: O3

void FT_Matrix_Multiply(FT_Matrix *a,FT_Matrix *b)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  
  if (b != (FT_Matrix *)0x0 && a != (FT_Matrix *)0x0) {
    lVar8 = (long)(int)a->xx;
    lVar3 = (long)(int)b->xx;
    lVar1 = lVar3 * lVar8;
    lVar5 = (long)(int)a->xy;
    lVar7 = (long)(int)b->yx;
    lVar2 = lVar7 * lVar5;
    lVar9 = (long)(int)b->xy;
    lVar8 = lVar8 * lVar9;
    lVar10 = (long)(int)b->yy;
    lVar5 = lVar5 * lVar10;
    lVar6 = (long)(int)a->yx;
    lVar3 = lVar3 * lVar6;
    lVar4 = (long)(int)a->yy;
    lVar7 = lVar7 * lVar4;
    lVar6 = lVar6 * lVar9;
    lVar4 = lVar4 * lVar10;
    b->xx = (long)(int)((ulong)(lVar2 + 0x8000 + (lVar2 >> 0x3f)) >> 0x10) +
            (long)(int)((ulong)(lVar1 + 0x8000 + (lVar1 >> 0x3f)) >> 0x10);
    b->xy = (long)(int)((ulong)(lVar5 + 0x8000 + (lVar5 >> 0x3f)) >> 0x10) +
            (long)(int)((ulong)(lVar8 + 0x8000 + (lVar8 >> 0x3f)) >> 0x10);
    b->yx = (long)(int)((ulong)(lVar7 + 0x8000 + (lVar7 >> 0x3f)) >> 0x10) +
            (long)(int)((ulong)(lVar3 + 0x8000 + (lVar3 >> 0x3f)) >> 0x10);
    b->yy = (long)(int)((ulong)(lVar4 + 0x8000 + (lVar4 >> 0x3f)) >> 0x10) +
            (long)(int)((ulong)(lVar6 + 0x8000 + (lVar6 >> 0x3f)) >> 0x10);
  }
  return;
}

Assistant:

FT_EXPORT_DEF( void )
  FT_Matrix_Multiply( const FT_Matrix*  a,
                      FT_Matrix        *b )
  {
    FT_Fixed  xx, xy, yx, yy;


    if ( !a || !b )
      return;

    xx = ADD_LONG( FT_MulFix( a->xx, b->xx ),
                   FT_MulFix( a->xy, b->yx ) );
    xy = ADD_LONG( FT_MulFix( a->xx, b->xy ),
                   FT_MulFix( a->xy, b->yy ) );
    yx = ADD_LONG( FT_MulFix( a->yx, b->xx ),
                   FT_MulFix( a->yy, b->yx ) );
    yy = ADD_LONG( FT_MulFix( a->yx, b->xy ),
                   FT_MulFix( a->yy, b->yy ) );

    b->xx = xx;
    b->xy = xy;
    b->yx = yx;
    b->yy = yy;
  }